

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O2

Abc_Cex_t * Llb4_Nonlin4TransformCex(Aig_Man_t *pAig,Vec_Ptr_t *vStates,int iCexPo,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p;
  sat_solver *s;
  Abc_Cex_t *p_00;
  void *pvVar4;
  Vec_Int_t *p_01;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  char *__s;
  uint uVar9;
  
  iVar1 = pAig->nRegs;
  iVar8 = pAig->nObjs[3];
  pAig->nRegs = 0;
  p = Cnf_Derive(pAig,iVar8);
  pAig->nRegs = iVar1;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (s == (sat_solver *)0x0) {
    puts("Llb4_Nonlin4TransformCex(): Counter-example generation has failed.");
LAB_006a8b29:
    Cnf_DataFree(p);
    return (Abc_Cex_t *)0x0;
  }
  iVar1 = sat_solver_simplify(s);
  if (iVar1 == 0) {
    puts("Llb4_Nonlin4TransformCex(): SAT solver is invalid.");
    sat_solver_delete(s);
    goto LAB_006a8b29;
  }
  p_00 = Abc_CexAlloc(pAig->nRegs,pAig->nTruePis,vStates->nSize);
  p_00->iFrame = vStates->nSize + -1;
  p_00->iPo = -1;
  iVar1 = pAig->nRegs;
  pvVar4 = Vec_PtrEntry(vStates,0);
  iVar8 = pAig->nRegs;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar8 * 2 - 1U) {
    iVar2 = iVar8 * 2;
  }
  p_01->nCap = iVar2;
  if (iVar2 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar2 << 2);
  }
  p_01->pArray = piVar5;
  for (iVar8 = 1; iVar8 < vStates->nSize; iVar8 = iVar8 + 1) {
    pvVar6 = Vec_PtrEntry(vStates,iVar8);
    p_01->nSize = 0;
    for (uVar9 = 0; iVar2 = pAig->nRegs, (int)uVar9 < iVar2; uVar9 = uVar9 + 1) {
      pvVar7 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar9);
      Vec_IntPush(p_01,(uint)((*(uint *)((long)pvVar4 + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) &
                              1) == 0) + p->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2);
    }
    for (uVar9 = 0; (int)uVar9 < iVar2; uVar9 = uVar9 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + uVar9);
      Vec_IntPush(p_01,(uint)((*(uint *)((long)pvVar6 + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) &
                              1) == 0) + p->pVarNums[*(int *)((long)pvVar4 + 0x24)] * 2);
      iVar2 = pAig->nRegs;
    }
    iVar2 = sat_solver_solve(s,p_01->pArray,p_01->pArray + p_01->nSize,0,0,0,0);
    if (iVar2 != 1) {
      printf("Llb4_Nonlin4TransformCex(): There is no transition between state %d and %d.\n",
             (ulong)(iVar8 - 1));
      Vec_IntFree(p_01);
      goto LAB_006a8e2c;
    }
    for (iVar2 = 0; iVar2 < pAig->nTruePis; iVar2 = iVar2 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar2);
      iVar3 = sat_solver_var_value(s,p->pVarNums[*(int *)((long)pvVar4 + 0x24)]);
      if (iVar3 != 0) {
        (&p_00[1].iPo)[iVar1 + iVar2 >> 5] =
             (&p_00[1].iPo)[iVar1 + iVar2 >> 5] | 1 << ((byte)(iVar1 + iVar2) & 0x1f);
      }
    }
    iVar1 = pAig->nTruePis + iVar1;
    pvVar4 = pvVar6;
  }
  p_01->nSize = 0;
  if (iCexPo < 0) {
    for (iVar8 = 0; iVar8 < pAig->nTruePos; iVar8 = iVar8 + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCos,iVar8);
      Vec_IntPush(p_01,p->pVarNums[*(int *)((long)pvVar6 + 0x24)] * 2);
    }
  }
  else {
    for (iVar8 = 0; iVar8 < pAig->nTruePos; iVar8 = iVar8 + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCos,iVar8);
      if (iCexPo == iVar8) {
        Vec_IntPush(p_01,p->pVarNums[*(int *)((long)pvVar6 + 0x24)] * 2);
      }
    }
  }
  iVar8 = sat_solver_addclause(s,p_01->pArray,p_01->pArray + p_01->nSize);
  if (iVar8 == 0) {
    __s = "Llb4_Nonlin4TransformCex(): The SAT solver is unsat after adding last clause.";
  }
  else {
    p_01->nSize = 0;
    for (uVar9 = 0; (int)uVar9 < pAig->nRegs; uVar9 = uVar9 + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + uVar9);
      Vec_IntPush(p_01,(uint)((*(uint *)((long)pvVar4 + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) &
                              1) == 0) + p->pVarNums[*(int *)((long)pvVar6 + 0x24)] * 2);
    }
    iVar2 = 0;
    iVar8 = sat_solver_solve(s,p_01->pArray,p_01->pArray + p_01->nSize,0,0,0,0);
    if (iVar8 == 1) {
      for (; iVar2 < pAig->nTruePis; iVar2 = iVar2 + 1) {
        pvVar4 = Vec_PtrEntry(pAig->vCis,iVar2);
        iVar8 = sat_solver_var_value(s,p->pVarNums[*(int *)((long)pvVar4 + 0x24)]);
        if (iVar8 != 0) {
          (&p_00[1].iPo)[iVar1 + iVar2 >> 5] =
               (&p_00[1].iPo)[iVar1 + iVar2 >> 5] | 1 << ((byte)(iVar1 + iVar2) & 0x1f);
        }
      }
      if (pAig->nTruePis + iVar1 != p_00->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Cex.c"
                      ,0xab,
                      "Abc_Cex_t *Llb4_Nonlin4TransformCex(Aig_Man_t *, Vec_Ptr_t *, int, int)");
      }
      Vec_IntFree(p_01);
      sat_solver_delete(s);
      Cnf_DataFree(p);
      iVar1 = Saig_ManFindFailedPoCex(pAig,p_00);
      if ((-1 < iVar1) && (iVar1 < pAig->nTruePos)) {
        p_00->iPo = iVar1;
        return p_00;
      }
      puts("Llb4_Nonlin4TransformCex(): Counter-example verification has FAILED.");
      goto LAB_006a8e39;
    }
    __s = "Llb4_Nonlin4TransformCex(): There is no last transition that makes the property fail.";
  }
  puts(__s);
  Vec_IntFree(p_01);
LAB_006a8e2c:
  sat_solver_delete(s);
  Cnf_DataFree(p);
LAB_006a8e39:
  free(p_00);
  return (Abc_Cex_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START
 

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Translates a sequence of states into a counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Llb4_Nonlin4TransformCex( Aig_Man_t * pAig, Vec_Ptr_t * vStates, int iCexPo, int fVerbose )
{
    Abc_Cex_t * pCex;
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vAssumps;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    unsigned * pNext, * pThis;
    int i, k, iBit, status, nRegs;//, clk = Abc_Clock();
/*
    Vec_PtrForEachEntry( unsigned *, vStates, pNext, i )
    {
        printf( "%4d : ", i );
        Extra_PrintBinary( stdout, pNext, Aig_ManRegNum(pAig) );
        printf( "\n" );
    }
*/
    // derive SAT solver
    nRegs = Aig_ManRegNum(pAig); pAig->nRegs = 0;
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    pAig->nRegs = nRegs;
//    Cnf_DataTranformPolarity( pCnf, 0 );
    // convert into SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        printf( "Llb4_Nonlin4TransformCex(): Counter-example generation has failed.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    // simplify the problem
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        printf( "Llb4_Nonlin4TransformCex(): SAT solver is invalid.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    // start the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(pAig), Saig_ManPiNum(pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = -1;

    // solve each time frame
    iBit = Saig_ManRegNum(pAig);
    pThis = (unsigned *)Vec_PtrEntry( vStates, 0 );
    vAssumps = Vec_IntAlloc( 2 * Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntryStart( unsigned *, vStates, pNext, i, 1 )
    {
        // create assumptions
        Vec_IntClear( vAssumps );
        Saig_ManForEachLo( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pThis,k) ) );
        Saig_ManForEachLi( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pNext,k) ) );
        // solve SAT problem
        status = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        // if the problem is SAT, get the counterexample
        if ( status != l_True )
        {
            printf( "Llb4_Nonlin4TransformCex(): There is no transition between state %d and %d.\n", i-1, i );
            Vec_IntFree( vAssumps );
            sat_solver_delete( pSat );
            Cnf_DataFree( pCnf );
            ABC_FREE( pCex );
            return NULL;
        }
        // get the assignment of PIs
        Saig_ManForEachPi( pAig, pObj, k )
            if ( sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) )
                Abc_InfoSetBit( pCex->pData, iBit + k );
        // update the counter
        iBit += Saig_ManPiNum(pAig);
        pThis = pNext;
    }

    // add the last frame when the property fails
    Vec_IntClear( vAssumps );
    if ( iCexPo >= 0 )
    {
        Saig_ManForEachPo( pAig, pObj, k )
            if ( k == iCexPo )
                Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 ) );
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 ) );
    }

    // add clause
    status = sat_solver_addclause( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps) );
    if ( status == 0 )
    {
        printf( "Llb4_Nonlin4TransformCex(): The SAT solver is unsat after adding last clause.\n" );
        Vec_IntFree( vAssumps );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        ABC_FREE( pCex );
        return NULL;
    }
    // create assumptions
    Vec_IntClear( vAssumps );
    Saig_ManForEachLo( pAig, pObj, k )
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pThis,k) ) );
    // solve the last frame
    status = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "Llb4_Nonlin4TransformCex(): There is no last transition that makes the property fail.\n" );
        Vec_IntFree( vAssumps );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        ABC_FREE( pCex );
        return NULL;
    }
    // get the assignment of PIs
    Saig_ManForEachPi( pAig, pObj, k )
        if ( sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) )
            Abc_InfoSetBit( pCex->pData, iBit + k );
    iBit += Saig_ManPiNum(pAig);
    assert( iBit == pCex->nBits );

    // free the sat_solver
    Vec_IntFree( vAssumps );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );

    // verify counter-example
    status = Saig_ManFindFailedPoCex( pAig, pCex );
    if ( status >= 0 && status < Saig_ManPoNum(pAig) )
        pCex->iPo = status;
    else
    {
        printf( "Llb4_Nonlin4TransformCex(): Counter-example verification has FAILED.\n" );
        ABC_FREE( pCex );
        return NULL;
    }
    // report the results
//    if ( fVerbose )
//       Abc_PrintTime( 1, "SAT-based cex generation time", Abc_Clock() - clk );
    return pCex;
}